

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  void *dst;
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(0x20000U - (int)srcSize >> 0xb);
  if (0x1ffff < srcSize) {
    uVar2 = 0;
  }
  sVar1 = uVar2 + (srcSize >> 8) + srcSize;
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  dst = ZSTD_customMalloc(sVar1,customMem);
  if (dst == (void *)0x0) {
    sVar1 = 0xffffffffffffffc0;
  }
  else {
    (zc->seqCollector).collectSequences = 1;
    (zc->seqCollector).seqStart = outSeqs;
    (zc->seqCollector).seqIndex = 0;
    (zc->seqCollector).maxSequences = outSeqsSize;
    ZSTD_compress2(zc,dst,sVar1,src,srcSize);
    customMem_00.opaque = (void *)0x0;
    customMem_00.customAlloc = (ZSTD_allocFunction)0x0;
    customMem_00.customFree = (ZSTD_freeFunction)0x0;
    ZSTD_customFree(dst,customMem_00);
    sVar1 = (zc->seqCollector).seqIndex;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
    ZSTD_customFree(dst, ZSTD_defaultCMem);
    return zc->seqCollector.seqIndex;
}